

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  Array<kj::_::HashBucket> *pAVar1;
  size_t *psVar2;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar3;
  uint uVar4;
  Entry *pEVar5;
  ArrayDisposer *pAVar6;
  Entry *pEVar7;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar8;
  Entry *pEVar9;
  uint uVar10;
  uint uVar11;
  Maybe<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry_&>
  MVar12;
  size_t sVar13;
  ulong uVar14;
  Entry *pEVar15;
  HashBucket *pHVar16;
  Scope *pSVar17;
  ulong uVar18;
  RawBrandedSchema *pRVar19;
  long lVar20;
  long lVar21;
  size_t __n;
  HashBucket *pHVar22;
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  ArrayPtr<const_unsigned_char> s;
  SchemaBindingsPair key;
  Array<kj::_::HashBucket> local_78;
  undefined8 *local_60;
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *local_58;
  RawBrandedSchema *local_50;
  size_t local_48;
  SchemaBindingsPair local_40;
  
  pSVar17 = bindings.ptr;
  if (bindings.size_ == 0) {
    pRVar19 = &schema->defaultBrand;
  }
  else {
    local_40.schema = schema;
    local_40.scopeBindings = pSVar17;
    MVar12 = kj::
             Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
             ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
                       ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                         *)&this->brands,&local_40);
    if (MVar12.ptr == (Entry *)0x0) {
      local_58 = &this->brands;
      local_48 = bindings.size_;
      local_50 = (RawBrandedSchema *)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      local_50->generic = (RawSchema *)0x0;
      local_50->scopes = (Scope *)0x0;
      local_50->dependencies = (Dependency *)0x0;
      local_50->scopeCount = 0;
      local_50->dependencyCount = 0;
      local_50->lazyInitializer = (Initializer *)0x0;
      pEVar5 = (this->brands).table.rows.builder.ptr;
      lVar20 = (long)(this->brands).table.rows.builder.pos - (long)pEVar5 >> 3;
      lVar21 = lVar20 * -0x5555555555555555;
      pHVar16 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      uVar18 = (long)pHVar16 * 2;
      if (uVar18 < ((this->brands).table.indexes.erasedCount + lVar21) * 3 + 3) {
        pAVar1 = &(this->brands).table.indexes.buckets;
        uVar14 = lVar20 * 0x5555555555555556 + 2;
        if (uVar14 < uVar18) {
          uVar14 = uVar18;
        }
        oldBuckets.size_ = uVar14;
        oldBuckets.ptr = pHVar16;
        kj::_::rehash(&local_78,(_ *)pAVar1->ptr,oldBuckets,in_R8);
        pHVar16 = pAVar1->ptr;
        if (pHVar16 != (HashBucket *)0x0) {
          sVar13 = (this->brands).table.indexes.buckets.size_;
          pAVar1->ptr = (HashBucket *)0x0;
          (this->brands).table.indexes.buckets.size_ = 0;
          pAVar6 = (this->brands).table.indexes.buckets.disposer;
          (*(code *)**(undefined8 **)pAVar6)(pAVar6,pHVar16,8,sVar13,sVar13,0);
        }
        (this->brands).table.indexes.buckets.ptr = local_78.ptr;
        (this->brands).table.indexes.buckets.size_ = local_78.size_;
        (this->brands).table.indexes.buckets.disposer = local_78.disposer;
      }
      local_78.ptr = (HashBucket *)
                     CONCAT44(bindings.ptr._4_4_ * 0xbfe3 + (int)bindings.ptr,
                              (int)((ulong)schema >> 0x20) * 0xbfe3 + (int)schema);
      s.size_ = 8;
      s.ptr = (uchar *)&local_78;
      uVar10 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
      uVar11 = kj::_::chooseBucket((uint)(uVar10 != 0),
                                   (uint)(this->brands).table.indexes.buckets.size_);
      pHVar16 = (HashBucket *)0x0;
      do {
        pHVar22 = (this->brands).table.indexes.buckets.ptr + uVar11;
        uVar4 = pHVar22->value;
        if (uVar4 == 1) {
          if (pHVar16 == (HashBucket *)0x0) {
            pHVar16 = pHVar22;
          }
        }
        else {
          if (uVar4 == 0) {
            if (pHVar16 != (HashBucket *)0x0) {
              psVar2 = &(this->brands).table.indexes.erasedCount;
              *psVar2 = *psVar2 - 1;
              pHVar22 = pHVar16;
            }
            *pHVar22 = (HashBucket)(((ulong)(uVar10 != 0) | lVar21 << 0x20) + 0x200000000);
            pEVar5 = (this->brands).table.rows.builder.pos;
            pEVar7 = (this->brands).table.rows.builder.endPtr;
            if (pEVar5 == pEVar7) {
              pEVar15 = (local_58->table).rows.builder.ptr;
              uVar18 = 4;
              if (pEVar7 != pEVar15) {
                uVar18 = ((long)pEVar7 - (long)pEVar15 >> 3) * 0x5555555555555556;
              }
              uVar14 = ((long)pEVar5 - (long)pEVar15 >> 3) * -0x5555555555555555;
              if (uVar18 <= uVar14 && uVar14 - uVar18 != 0) {
                (this->brands).table.rows.builder.pos = pEVar15 + uVar18;
              }
              pEVar15 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                           (0x18,0,uVar18,(_func_void_void_ptr *)0x0,
                                            (_func_void_void_ptr *)0x0);
              pEVar5 = pEVar15 + uVar18;
              local_60 = &kj::_::HeapArrayDisposer::instance;
              pEVar7 = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)pEVar7;
              local_78.ptr = (HashBucket *)pEVar15;
              local_78.disposer = (ArrayDisposer *)pEVar5;
              if (__n != 0) {
                local_78.size_ = (size_t)pEVar15;
                memcpy(pEVar15,pEVar7,__n);
              }
              pEVar7 = (local_58->table).rows.builder.ptr;
              if (pEVar7 != (Entry *)0x0) {
                pRVar8 = (this->brands).table.rows.builder.pos;
                pEVar9 = (this->brands).table.rows.builder.endPtr;
                (local_58->table).rows.builder.ptr = (Entry *)0x0;
                (local_58->table).rows.builder.pos =
                     (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                      *)0x0;
                (local_58->table).rows.builder.endPtr = (Entry *)0x0;
                pAVar6 = (this->brands).table.rows.builder.disposer;
                local_78.size_ = (size_t)((long)pEVar15 + __n);
                (*(code *)**(undefined8 **)pAVar6)
                          (pAVar6,pEVar7,0x18,
                           ((long)pRVar8 - (long)pEVar7 >> 3) * -0x5555555555555555,
                           ((long)pEVar9 - (long)pEVar7 >> 3) * -0x5555555555555555,0);
              }
              (this->brands).table.rows.builder.ptr = pEVar15;
              (this->brands).table.rows.builder.pos =
                   (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                    *)((long)pEVar15 + __n);
              (this->brands).table.rows.builder.endPtr = pEVar5;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
            }
            pRVar8 = (this->brands).table.rows.builder.pos;
            (pRVar8->key).schema = schema;
            (pRVar8->key).scopeBindings = pSVar17;
            pRVar8->value = local_50;
            ppRVar3 = &(this->brands).table.rows.builder.pos;
            *ppRVar3 = *ppRVar3 + 1;
            local_50->generic = schema;
            local_50->scopes = pSVar17;
            local_50->scopeCount = (uint32_t)local_48;
            local_50->lazyInitializer = &(this->brandedInitializer).super_Initializer;
            return local_50;
          }
          if (((pHVar22->hash == (uint)(uVar10 != 0)) && (pEVar5[uVar4 - 2].key.schema == schema))
             && (pEVar5[uVar4 - 2].key.scopeBindings == pSVar17)) {
            kj::_::throwDuplicateTableRow();
          }
        }
        sVar13 = (ulong)uVar11 + 1;
        uVar11 = (uint)sVar13;
        if (sVar13 == (this->brands).table.indexes.buckets.size_) {
          uVar11 = 0;
        }
      } while( true );
    }
    pRVar19 = (MVar12.ptr)->value;
  }
  return pRVar19;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  // Note that even if `bindings` is empty, we never want to return defaultBrand here because
  // defaultBrand has special status. Normally, the lack of bindings means all parameters are
  // "unspecified", which means their bindings are unknown and should be treated as AnyPointer.
  // But defaultBrand represents a special case where all parameters are still parameters -- they
  // haven't been bound in the first place. defaultBrand is used to represent the unbranded generic
  // type, while a no-binding brand is equivalent to binding all parameters to AnyPointer.

  if (bindings.size() == 0) {
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_MAYBE(existing, brands.find(key)) {
    return *existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }